

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O2

bool __thiscall
ON_SubDMeshImpl::GetTightBoundingBox
          (ON_SubDMeshImpl *this,ON_BoundingBox *bbox,bool bGrowBox,ON_Xform *xform)

{
  ON_SubDMeshFragment *this_00;
  bool bVar1;
  uint count;
  ON_SubDMeshFragment **ppOVar2;
  ON_BoundingBox local_bbox;
  
  local_bbox.m_max.y = ON_BoundingBox::EmptyBoundingBox.m_max.y;
  local_bbox.m_max.z = ON_BoundingBox::EmptyBoundingBox.m_max.z;
  local_bbox.m_min.z = ON_BoundingBox::EmptyBoundingBox.m_min.z;
  local_bbox.m_max.x = ON_BoundingBox::EmptyBoundingBox.m_max.x;
  local_bbox.m_min.x = ON_BoundingBox::EmptyBoundingBox.m_min.x;
  local_bbox.m_min.y = ON_BoundingBox::EmptyBoundingBox.m_min.y;
  if ((xform == (ON_Xform *)0x0) || (bVar1 = ON_Xform::IsIdentity(xform,0.0), bVar1)) {
    local_bbox.m_min.x = (this->m_bbox).m_min.x;
    local_bbox.m_min.y = (this->m_bbox).m_min.y;
    local_bbox.m_min.z = (this->m_bbox).m_min.z;
    local_bbox.m_max.x = (this->m_bbox).m_max.x;
    local_bbox.m_max.y = (this->m_bbox).m_max.y;
    local_bbox.m_max.z = (this->m_bbox).m_max.z;
  }
  else {
    ppOVar2 = &this->m_first_fragment;
    while (this_00 = *ppOVar2, this_00 != (ON_SubDMeshFragment *)0x0) {
      count = ON_SubDMeshFragment::PointCount(this_00);
      ON_GetPointListBoundingBox
                (3,false,count,(int)this_00->m_P_stride,this_00->m_P,&local_bbox,
                 (uint)(this_00 != this->m_first_fragment),xform);
      ppOVar2 = &this_00->m_next_fragment;
    }
  }
  if ((bGrowBox) && (bVar1 = ON_BoundingBox::IsValid(bbox), bVar1)) {
    ON_BoundingBox::Union(bbox,&local_bbox);
    return true;
  }
  (bbox->m_max).y = local_bbox.m_max.y;
  (bbox->m_max).z = local_bbox.m_max.z;
  (bbox->m_min).z = local_bbox.m_min.z;
  (bbox->m_max).x = local_bbox.m_max.x;
  (bbox->m_min).x = local_bbox.m_min.x;
  (bbox->m_min).y = local_bbox.m_min.y;
  return true;
}

Assistant:

bool ON_SubDMeshImpl::GetTightBoundingBox(
  ON_BoundingBox& bbox,
  bool bGrowBox,
  const ON_Xform* xform
  ) const
{
  ON_BoundingBox local_bbox = ON_BoundingBox::EmptyBoundingBox;
  if (nullptr != xform && xform->IsIdentity())
    xform = nullptr;

  if (nullptr == xform)
  {
    local_bbox = m_bbox;
  }
  else
  {
    for (const ON_SubDMeshFragment* fragment = m_first_fragment; nullptr != fragment; fragment = fragment->m_next_fragment)
      ON_GetPointListBoundingBox(3, 0, fragment->PointCount(), (int)fragment->m_P_stride, fragment->m_P, local_bbox, fragment != m_first_fragment, xform);
  }

  if (bGrowBox && bbox.IsValid())
    bbox.Union(local_bbox);
  else
    bbox = local_bbox;

  return true;
}